

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::BufferSupport::initPrograms
          (BufferSupport *this,SourceCollections *programCollection)

{
  ostream *poVar1;
  int iVar2;
  char *__s;
  string bufferTypeStr;
  ostringstream declSrc;
  ostringstream copySrc;
  string sStack_368;
  string local_348;
  string local_328 [32];
  allocator<char> local_308 [376];
  ostringstream local_190 [376];
  
  __s = "buffer";
  if (this->m_bufferType == BUFFER_TYPE_UNIFORM) {
    __s = "uniform";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_328,__s,local_308);
  iVar2 = (this->m_resourceDesc).size.m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  poVar1 = std::operator<<((ostream *)local_308,"layout(set = 0, binding = 0, std140) readonly ");
  poVar1 = std::operator<<(poVar1,local_328);
  poVar1 = std::operator<<(poVar1," Input {\n");
  poVar1 = std::operator<<(poVar1,"    uvec4 data[");
  iVar2 = iVar2 >> 4;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} b_in;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(set = 0, binding = 1, std140) writeonly buffer Output {\n"
                          );
  poVar1 = std::operator<<(poVar1,"    uvec4 data[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,"];\n");
  std::operator<<(poVar1,"} b_out;\n");
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"    for (int i = 0; i < ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,"; ++i) {\n");
  poVar1 = std::operator<<(poVar1,"        b_out.data[i] = b_in.data[i];\n");
  std::operator<<(poVar1,"    }\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  initPassthroughPrograms
            (programCollection,&this->m_shaderPrefix,&local_348,&sStack_368,this->m_stage);
  std::__cxx11::string::~string((string *)&sStack_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  std::__cxx11::string::~string(local_328);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		DE_ASSERT((m_resourceDesc.size.x() % sizeof(tcu::UVec4)) == 0);

		const std::string	bufferTypeStr	= (m_bufferType == BUFFER_TYPE_UNIFORM ? "uniform" : "buffer");
		const int			numVecElements	= static_cast<int>(m_resourceDesc.size.x() / sizeof(tcu::UVec4));  // std140 must be aligned to a multiple of 16

		std::ostringstream declSrc;
		declSrc << "layout(set = 0, binding = 0, std140) readonly " << bufferTypeStr << " Input {\n"
				<< "    uvec4 data[" << numVecElements << "];\n"
				<< "} b_in;\n"
				<< "\n"
				<< "layout(set = 0, binding = 1, std140) writeonly buffer Output {\n"
				<< "    uvec4 data[" << numVecElements << "];\n"
				<< "} b_out;\n";

		std::ostringstream copySrc;
		copySrc << "    for (int i = 0; i < " << numVecElements << "; ++i) {\n"
				<< "        b_out.data[i] = b_in.data[i];\n"
				<< "    }\n";

		initPassthroughPrograms(programCollection, m_shaderPrefix, declSrc.str(), copySrc.str(), m_stage);
	}